

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddErrorSchemaLocation
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,ValueType *result,PointerType *schema)

{
  char *pcVar1;
  SizeType SVar2;
  SchemaType *pSVar3;
  char *pcVar4;
  Ch *__src;
  Ch *s;
  CrtAllocator *pCVar5;
  StringRefType *pSVar6;
  ValueType schemaRef;
  Stack<rapidjson::CrtAllocator> local_a8;
  StringRefType local_70;
  PointerType local_60;
  
  local_a8.stack_ = (char *)0x0;
  local_a8.stackTop_ = (char *)0x0;
  local_a8.allocator_ = (CrtAllocator *)0x0;
  local_a8.ownAllocator_ = (CrtAllocator *)0x0;
  local_a8.stackEnd_ = (char *)0x0;
  local_a8.initialCapacity_ = 0x100;
  pSVar3 = CurrentSchema(this);
  SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
                    (&pSVar3->uri_);
  if (SVar2 != 0) {
    pcVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&local_a8,(ulong)SVar2);
    pSVar3 = CurrentSchema(this);
    __src = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString(&pSVar3->uri_);
    memcpy(pcVar4,__src,(ulong)SVar2);
  }
  if (schema->tokenCount_ == 0) {
    GetInvalidSchemaPointer(&local_60,this);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
              ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                *)&local_60,
               (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_a8);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_60);
  }
  else {
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
              ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                *)schema,
               (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_a8);
  }
  s = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_a8);
  pcVar1 = local_a8.stackTop_;
  pcVar4 = local_a8.stack_;
  pCVar5 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_60,s,
             (int)pcVar1 - (int)pcVar4,pCVar5);
  pSVar6 = GetSchemaRefString();
  local_70.s = pSVar6->s;
  local_70.length = pSVar6->length;
  pCVar5 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (result,&local_70,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_60,pCVar5);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_60);
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_a8);
  return;
}

Assistant:

void AddErrorSchemaLocation(ValueType& result, PointerType schema = PointerType()) {
        GenericStringBuffer<EncodingType> sb;
        SizeType len = CurrentSchema().GetURI().GetStringLength();
        if (len) memcpy(sb.Push(len), CurrentSchema().GetURI().GetString(), len * sizeof(Ch));
        if (schema.GetTokenCount()) schema.StringifyUriFragment(sb);
        else GetInvalidSchemaPointer().StringifyUriFragment(sb);
        ValueType schemaRef(sb.GetString(), static_cast<SizeType>(sb.GetSize() / sizeof(Ch)),
            GetStateAllocator());
        result.AddMember(GetSchemaRefString(), schemaRef, GetStateAllocator());
    }